

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
chatra::emb::io::StandardFileSystem::saveFile
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          StandardFileSystem *this,IFile *file)

{
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writeRawInt(__return_storage_ptr__,(ulong)(file[6]._vptr_IFile != (_func_int **)0x0));
  if (file[6]._vptr_IFile != (_func_int **)0x0) {
    writeString(__return_storage_ptr__,(string *)(file + 1));
    writeRawInt(__return_storage_ptr__,(ulong)*(uint *)&file[5]._vptr_IFile);
    writeRawInt(__return_storage_ptr__,(int64_t)file[8]._vptr_IFile);
    (*file->_vptr_IFile[2])(file);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> saveFile(IFile* file) override {
		auto* f = static_cast<StandardFileCommon*>(file);
		std::vector<uint8_t> buffer;
		//std::printf("saveFile %s, flags = %u, current = %zu, length = %zu, fp = %s\n", f->fileName.data(),
		//		static_cast<unsigned>(f->flags), f->current, f->length, f->fp != nullptr ? "non-null" : "null");
		writeInt(buffer, f->fp == nullptr ? 0 : 1);
		if (f->fp != nullptr) {
			writeString(buffer, f->fileName);
			writeInt(buffer, f->flags);
			writeInt(buffer, f->current);
			f->close();
		}
		return buffer;
	}